

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_math_random(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  ulong uVar1;
  JSValue JVar2;
  
  uVar1 = ctx->random_state >> 0xc ^ ctx->random_state;
  uVar1 = uVar1 << 0x19 ^ uVar1;
  uVar1 = uVar1 >> 0x1b ^ uVar1;
  ctx->random_state = uVar1;
  JVar2.tag = 7;
  JVar2.u.float64 = (double)(uVar1 * 0x2545f4914f6cdd1d >> 0xc | 0x3ff0000000000000) + -1.0;
  return JVar2;
}

Assistant:

static uint64_t xorshift64star(uint64_t *pstate)
{
    uint64_t x;
    x = *pstate;
    x ^= x >> 12;
    x ^= x << 25;
    x ^= x >> 27;
    *pstate = x;
    return x * 0x2545F4914F6CDD1D;
}